

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,(unsigned_char)4>(Thread *this)

{
  difference_type dVar1;
  Simd<unsigned_int,_(unsigned_char)__x04_> val;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  dVar1 = std::
          __count_if<unsigned_int*,__gnu_cxx::__ops::_Iter_pred<wabt::interp::Thread::DoSimdIsTrue<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,(unsigned_char)4>()::_lambda(unsigned_int)_1_>>
                    (&local_18);
  Push<bool>(this,3 < dVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}